

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_signatureutil.cpp
# Opt level: O2

void __thiscall
SignatureUtil_CalculateEcSignature_Test::TestBody(SignatureUtil_CalculateEcSignature_Test *this)

{
  bool bVar1;
  char *pcVar2;
  string local_b8;
  ByteData err_sig;
  AssertionResult gtest_ar_2;
  AssertHelper local_68;
  ByteData sig;
  Privkey privkey;
  ByteData256 sighash;
  
  std::__cxx11::string::string
            ((string *)&privkey,"2a67f03e63a6a422125878b40b82da593be8d4efaafe88ee528af6e5a9955c6e",
             (allocator *)&local_b8);
  cfd::core::ByteData256::ByteData256(&sighash,(string *)&privkey);
  std::__cxx11::string::~string((string *)&privkey);
  std::__cxx11::string::string
            ((string *)&local_b8,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             (allocator *)&sig);
  cfd::core::Privkey::Privkey(&privkey,&local_b8,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_b8);
  cfd::core::ByteData::ByteData(&sig);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SignatureUtil::CalculateEcSignature((ByteData *)&local_b8,&sighash,&privkey,true);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&sig.data_,&local_b8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&err_sig,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_signatureutil.cpp"
               ,0x19,
               "Expected: sig = SignatureUtil::CalculateEcSignature(sighash, privkey, true) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&err_sig,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&err_sig);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_b8,&sig);
  testing::internal::CmpHelperSTREQ
            ((internal *)&err_sig,"sig.GetHex().c_str()",
             "\"0e68b55347fe37338beb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f2c\""
             ,local_b8._M_dataplus._M_p,
             "0e68b55347fe37338beb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f2c"
            );
  std::__cxx11::string::~string((string *)&local_b8);
  if ((char)err_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_b8);
    if (err_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)err_sig.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_signatureutil.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&err_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SignatureUtil::CalculateEcSignature((ByteData *)&local_b8,&sighash,&privkey,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                (&sig.data_,&local_b8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&err_sig,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_signatureutil.cpp"
               ,0x20,
               "Expected: sig = SignatureUtil::CalculateEcSignature(sighash, privkey, false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&err_sig,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&err_sig);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_b8,&sig);
  testing::internal::CmpHelperSTREQ
            ((internal *)&err_sig,"sig.GetHex().c_str()",
             "\"0e68b55347fe37338beb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f2c\""
             ,local_b8._M_dataplus._M_p,
             "0e68b55347fe37338beb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f2c"
            );
  std::__cxx11::string::~string((string *)&local_b8);
  if ((char)err_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_b8);
    if (err_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)err_sig.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_signatureutil.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&err_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  cfd::core::ByteData::ByteData(&err_sig);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::Privkey::Privkey((Privkey *)&local_b8);
    cfd::core::SignatureUtil::CalculateEcSignature
              ((ByteData *)&gtest_ar_2,&sighash,(Privkey *)&local_b8,true);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&err_sig.data_,&gtest_ar_2);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_2);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
  }
  testing::Message::Message((Message *)&local_b8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_signatureutil.cpp"
             ,0x28,
             "Expected: (err_sig = SignatureUtil::CalculateEcSignature(sighash, Privkey(), true)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_b8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_b8,&err_sig);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"err_sig.GetHex().c_str()","\"\"",local_b8._M_dataplus._M_p,"")
  ;
  std::__cxx11::string::~string((string *)&local_b8);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar_2.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_signatureutil.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&err_sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
  return;
}

Assistant:

TEST(SignatureUtil, CalculateEcSignature) {
  ByteData256 sighash(
      "2a67f03e63a6a422125878b40b82da593be8d4efaafe88ee528af6e5a9955c6e");
  Privkey privkey(
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");

  // has_grind_r true
  ByteData sig;
  EXPECT_NO_THROW(
      sig = SignatureUtil::CalculateEcSignature(sighash, privkey, true));
  EXPECT_STREQ(
      sig.GetHex().c_str(),
      "0e68b55347fe37338beb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f2c");

  // has_grind_r false
  EXPECT_NO_THROW(
      sig = SignatureUtil::CalculateEcSignature(sighash, privkey, false));
  EXPECT_STREQ(
      sig.GetHex().c_str(),
      "0e68b55347fe37338beb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f2c");

  ByteData err_sig;
  EXPECT_THROW(
      (err_sig = SignatureUtil::CalculateEcSignature(sighash, Privkey(), true)),
      CfdException);
  EXPECT_STREQ(err_sig.GetHex().c_str(), "");
}